

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O0

CScript * anon_unknown.dwarf_6f47f7::ScriptPubKey
                    (MiniscriptContext ctx,CScript *script,TaprootBuilder *builder)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  bool bVar1;
  CScript *pCVar2;
  CScript *in_RCX;
  __extent_storage<18446744073709551615UL> in_RDI;
  long in_FS_OFFSET;
  MiniscriptContext in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  WitnessV0ScriptHash *in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 uVar3;
  XOnlyPubKey *in_stack_fffffffffffffec8;
  TaprootBuilder *in_stack_fffffffffffffed0;
  opcodetype opcode;
  CScript *in_stack_fffffffffffffee0;
  CScript *pCVar4;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  TaprootBuilder *in_stack_ffffffffffffff00;
  Span<const_unsigned_char> in_stack_ffffffffffffff68;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = (CScript *)in_RDI._M_extent_value;
  bVar1 = miniscript::IsTapscript(in_stack_fffffffffffffea8);
  if (bVar1) {
    uVar3 = 0;
    Span<const_unsigned_char>::Span<CScript>
              ((Span<const_unsigned_char> *)(ulong)in_stack_fffffffffffffeb8,in_RCX,
               (type)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    TaprootBuilder::Add(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                        in_stack_ffffffffffffff68,in_stack_fffffffffffffef8,
                        SUB81((ulong)pCVar4 >> 0x38,0));
    TaprootBuilder::Finalize(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    TaprootBuilder::GetOutput
              ((TaprootBuilder *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<WitnessV1Taproot,void,void,WitnessV1Taproot,void>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)CONCAT44(uVar3,in_stack_fffffffffffffeb8),(WitnessV1Taproot *)in_RCX);
    GetScriptForDestination
              ((CTxDestination *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  else {
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    uStack_20 = 0;
    opcode = (opcodetype)((ulong)&local_28 >> 0x20);
    CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    pCVar2 = CScript::operator<<(in_stack_fffffffffffffee0,opcode);
    WitnessV0ScriptHash::WitnessV0ScriptHash
              ((WitnessV0ScriptHash *)in_stack_fffffffffffffed0,(CScript *)in_stack_fffffffffffffec8
              );
    std::span<const_unsigned_char,_18446744073709551615UL>::span<WitnessV0ScriptHash>
              ((span<const_unsigned_char,_18446744073709551615UL> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               in_stack_fffffffffffffeb0);
    b._M_extent._M_extent_value = in_RDI._M_extent_value;
    b._M_ptr = (pointer)pCVar2;
    CScript::operator<<((CScript *)in_stack_fffffffffffffec8,b);
    CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     (CScript *)0x79fcfc);
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pCVar4;
  }
  __stack_chk_fail();
}

Assistant:

CScript ScriptPubKey(miniscript::MiniscriptContext ctx, const CScript& script, TaprootBuilder& builder)
{
    if (!miniscript::IsTapscript(ctx)) return CScript() << OP_0 << WitnessV0ScriptHash(script);

    // For Taproot outputs we always use a tree with a single script and a dummy internal key.
    builder.Add(0, script, TAPROOT_LEAF_TAPSCRIPT);
    builder.Finalize(XOnlyPubKey::NUMS_H);
    return GetScriptForDestination(builder.GetOutput());
}